

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall
QString::replace(QString *this,QString *before,QString *after,CaseSensitivity cs)

{
  QChar *pQVar1;
  QString *pQVar2;
  undefined4 in_ECX;
  QString *in_RDX;
  QString *in_RSI;
  QChar *in_RDI;
  QString *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe0;
  CaseSensitivity cs_00;
  
  constData((QString *)0x14d33f);
  size(in_RSI);
  pQVar1 = constData((QString *)0x14d35d);
  cs_00 = (CaseSensitivity)((ulong)pQVar1 >> 0x20);
  size(in_RDX);
  pQVar2 = replace(unaff_retaddr,in_RDI,(qsizetype)in_RSI,(QChar *)in_RDX,
                   CONCAT44(in_ECX,in_stack_ffffffffffffffe0),cs_00);
  return pQVar2;
}

Assistant:

QString &QString::replace(const QString &before, const QString &after, Qt::CaseSensitivity cs)
{
    return replace(before.constData(), before.size(), after.constData(), after.size(), cs);
}